

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *comp;
  InstanceSymbol *this_00;
  bool bVar1;
  SymbolKind SVar2;
  InvalidExpression *pIVar3;
  Diagnostic *this_01;
  Expression *pEVar4;
  SourceRange sourceRange;
  InvalidExpression *local_28;
  
  if (argIndex == 0) {
    pEVar4 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar4;
  }
  comp = ((context->scope).ptr)->compilation;
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (bVar1) {
    pIVar3 = (InvalidExpression *)
             ArbitrarySymbolExpression::fromSyntax
                       (comp,(NameSyntax *)syntax,context,(bitmask<slang::ast::LookupFlags>)0x0);
    if ((pIVar3->super_Expression).kind == ArbitrarySymbol) {
      this_00 = (InstanceSymbol *)pIVar3->child;
      SVar2 = (this_00->super_InstanceSymbolBase).super_Symbol.kind;
      if (1 < SVar2 - Net) {
        if ((SVar2 != Instance) || (bVar1 = InstanceSymbol::isModule(this_00), !bVar1)) {
          bVar1 = Scope::isUninstantiated((context->scope).ptr);
          if (!bVar1) {
            ASTContext::addDiag(context,(DiagCode)0x9000b,(pIVar3->super_Expression).sourceRange);
          }
          local_28 = pIVar3;
          pIVar3 = BumpAllocator::
                   emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                             (&comp->super_BumpAllocator,(Expression **)&local_28,comp->errorType);
          return &pIVar3->super_Expression;
        }
        SVar2 = (this_00->super_InstanceSymbolBase).super_Symbol.kind;
      }
      if (((SVar2 - Variable < 0x19) && ((0x1800c0fU >> (SVar2 - Variable & 0x1f) & 1) != 0)) &&
         (*(int *)&this_00[2].body == 0)) {
        this_01 = ASTContext::addDiag(context,(DiagCode)0x4000b,
                                      (pIVar3->super_Expression).sourceRange);
        Diagnostic::operator<<(this_01,(this_00->super_InstanceSymbolBase).super_Symbol.name);
      }
    }
  }
  else {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x9000b,sourceRange);
    local_28 = (InvalidExpression *)0x0;
    pIVar3 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&comp->super_BumpAllocator,&local_28,comp->errorType);
  }
  return &pIVar3->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }